

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O2

void * pem_read_RSA_PUBKEY_d2i(void **x,uchar **inp,long len)

{
  rsa_st *prVar1;
  _Head_base<0UL,_rsa_st_*,_false> _Stack_38;
  _Head_base<0UL,_evp_pkey_st_*,_false> _Stack_30;
  CBS CStack_28;
  
  if (len < 0) {
    prVar1 = (rsa_st *)0x0;
  }
  else {
    CStack_28.data = *inp;
    CStack_28.len = len;
    _Stack_30._M_head_impl = EVP_parse_public_key(&CStack_28);
    if ((EVP_PKEY *)_Stack_30._M_head_impl == (EVP_PKEY *)0x0) {
      prVar1 = (rsa_st *)0x0;
    }
    else {
      prVar1 = (rsa_st *)EVP_PKEY_get1_RSA((EVP_PKEY *)_Stack_30._M_head_impl);
      _Stack_38._M_head_impl = prVar1;
      if (prVar1 != (rsa_st *)0x0) {
        if (x != (void **)0x0) {
          RSA_free((RSA *)*x);
          *x = prVar1;
        }
        *inp = CStack_28.data;
        _Stack_38._M_head_impl = (rsa_st *)0x0;
      }
      std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&_Stack_38);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&_Stack_30);
  }
  return prVar1;
}

Assistant:

static DSA *pkey_get_dsa(EVP_PKEY *key, DSA **dsa) {
  DSA *dtmp;
  if (!key) {
    return NULL;
  }
  dtmp = EVP_PKEY_get1_DSA(key);
  EVP_PKEY_free(key);
  if (!dtmp) {
    return NULL;
  }
  if (dsa) {
    DSA_free(*dsa);
    *dsa = dtmp;
  }
  return dtmp;
}